

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_list_view_begin(nk_context *ctx,nk_list_view *view,char *title,nk_flags flags,int row_height,
                      int row_count)

{
  uint uVar1;
  nk_window *win;
  nk_table *pnVar2;
  nk_panel *pnVar3;
  long lVar4;
  nk_hash name;
  int iVar5;
  nk_uint *x_offset;
  nk_uint *y_offset;
  nk_table *pnVar6;
  nk_uint value;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5696,
                  "int nk_list_view_begin(struct nk_context *, struct nk_list_view *, const char *, nk_flags, int, int)"
                 );
  }
  if (view == (nk_list_view *)0x0) {
    __assert_fail("view",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5697,
                  "int nk_list_view_begin(struct nk_context *, struct nk_list_view *, const char *, nk_flags, int, int)"
                 );
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5698,
                  "int nk_list_view_begin(struct nk_context *, struct nk_list_view *, const char *, nk_flags, int, int)"
                 );
  }
  win = ctx->current;
  if (*title == '\0') {
    lVar9 = 0;
  }
  else {
    lVar9 = 0;
    do {
      lVar4 = lVar9 + 1;
      lVar9 = lVar9 + 1;
    } while (title[lVar4] != '\0');
  }
  fVar11 = (ctx->style).window.spacing.y;
  value = flags;
  name = nk_murmur_hash(title,(int)lVar9,2);
  pnVar6 = win->tables;
  for (pnVar2 = pnVar6; pnVar2 != (nk_table *)0x0; pnVar2 = pnVar2->next) {
    uVar7 = (ulong)pnVar2->size;
    if (uVar7 != 0) {
      x_offset = pnVar2->values;
      do {
        if (x_offset[-0x3b] == name) {
          uVar1 = win->seq;
          pnVar2->seq = uVar1;
          goto LAB_0013a760;
        }
        x_offset = x_offset + 1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    value = (nk_uint)uVar7;
  }
  x_offset = nk_add_value(ctx,win,name,value);
  y_offset = nk_add_value(ctx,win,name + 1,value);
  *y_offset = 0;
  *x_offset = 0;
LAB_0013a78c:
  iVar10 = (int)fVar11;
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  view->scroll_value = *y_offset;
  view->scroll_pointer = y_offset;
  *y_offset = 0;
  iVar5 = nk_group_scrolled_offset_begin(ctx,x_offset,y_offset,title,flags);
  pnVar3 = ctx->current->layout;
  iVar8 = 1;
  if (1 < row_count) {
    iVar8 = row_count;
  }
  view->total_height = iVar8 * (iVar10 + row_height);
  fVar12 = (float)(iVar10 + row_height);
  fVar11 = (float)view->scroll_value / fVar12;
  iVar10 = (int)(float)(~-(uint)(fVar11 <= 0.0) & (uint)fVar11);
  view->begin = iVar10;
  fVar12 = (pnVar3->clip).h / fVar12;
  iVar8 = (uint)((float)(int)fVar12 < fVar12) + (int)fVar12;
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  view->count = iVar8;
  view->end = iVar8 + iVar10;
  view->ctx = ctx;
  return iVar5;
LAB_0013a760:
  uVar7 = (ulong)pnVar6->size;
  if (uVar7 != 0) {
    y_offset = pnVar6->values;
    do {
      if (y_offset[-0x3b] == name + 1) {
        pnVar6->seq = uVar1;
        goto LAB_0013a78c;
      }
      y_offset = y_offset + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  pnVar6 = pnVar6->next;
  goto LAB_0013a760;
}

Assistant:

NK_API int
nk_list_view_begin(struct nk_context *ctx, struct nk_list_view *view,
    const char *title, nk_flags flags, int row_height, int row_count)
{
    int title_len;
    nk_hash title_hash;
    nk_uint *x_offset;
    nk_uint *y_offset;

    int result;
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *style;
    struct nk_vec2 item_spacing;

    NK_ASSERT(ctx);
    NK_ASSERT(view);
    NK_ASSERT(title);
    if (!ctx || !view || !title) return 0;

    win = ctx->current;
    style = &ctx->style;
    item_spacing = style->window.spacing;
    row_height += NK_MAX(0, (int)item_spacing.y);

    /* find persistent list view scrollbar offset */
    title_len = (int)nk_strlen(title);
    title_hash = nk_murmur_hash(title, (int)title_len, NK_PANEL_GROUP);
    x_offset = nk_find_value(win, title_hash);
    if (!x_offset) {
        x_offset = nk_add_value(ctx, win, title_hash, 0);
        y_offset = nk_add_value(ctx, win, title_hash+1, 0);

        NK_ASSERT(x_offset);
        NK_ASSERT(y_offset);
        if (!x_offset || !y_offset) return 0;
        *x_offset = *y_offset = 0;
    } else y_offset = nk_find_value(win, title_hash+1);
    view->scroll_value = *y_offset;
    view->scroll_pointer = y_offset;

    *y_offset = 0;
    result = nk_group_scrolled_offset_begin(ctx, x_offset, y_offset, title, flags);
    win = ctx->current;
    layout = win->layout;

    view->total_height = row_height * NK_MAX(row_count,1);
    view->begin = (int)NK_MAX(((float)view->scroll_value / (float)row_height), 0.0f);
    view->count = (int)NK_MAX(nk_iceilf((layout->clip.h)/(float)row_height), 0);
    view->end = view->begin + view->count;
    view->ctx = ctx;
    return result;
}